

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::set_help_flag(App *this,string *flag_name,string *help_description)

{
  bool bVar1;
  Option *this_00;
  long in_RDI;
  Option *unaff_retaddr;
  App *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  App *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x170) != 0) {
    remove_option(in_stack_00000008,unaff_retaddr);
    *(undefined8 *)(in_RDI + 0x170) = 0;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a7467);
  if (!bVar1) {
    ::std::__cxx11::string::string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this_00 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    *(Option **)(in_RDI + 0x170) = this_00;
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    OptionBase<CLI::Option>::configurable(*(OptionBase<CLI::Option> **)(in_RDI + 0x170),false);
  }
  return *(Option **)(in_RDI + 0x170);
}

Assistant:

CLI11_INLINE Option *App::set_help_flag(std::string flag_name, const std::string &help_description) {
    // take flag_description by const reference otherwise add_flag tries to assign to help_description
    if(help_ptr_ != nullptr) {
        remove_option(help_ptr_);
        help_ptr_ = nullptr;
    }

    // Empty name will simply remove the help flag
    if(!flag_name.empty()) {
        help_ptr_ = add_flag(flag_name, help_description);
        help_ptr_->configurable(false);
    }

    return help_ptr_;
}